

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# StringLowering.cpp
# Opt level: O0

void __thiscall wasm::StringLowering::updateTypes(StringLowering *this,Module *module)

{
  bool bVar1;
  pointer pFVar2;
  size_t sVar3;
  Type *pTVar4;
  mapped_type *pmVar5;
  reference pHVar6;
  Signature SVar7;
  Iterator IVar8;
  ParentIndexIterator<const_wasm::Type_*,_wasm::Type::Iterator> PVar9;
  ParentIndexIterator<const_wasm::Type_*,_wasm::Type::Iterator> PVar10;
  optional<wasm::HeapType> oVar11;
  bool local_39a;
  byte local_2f1;
  vector<wasm::HeapType,_std::allocator<wasm::HeapType>_> local_2e8;
  TypeMapper local_2c8;
  Field local_220;
  _Storage<wasm::HeapType,_true> local_210;
  undefined1 local_208;
  HeapType local_200;
  HeapType type;
  iterator __end2_1;
  iterator __begin2_1;
  vector<wasm::HeapType,_std::allocator<wasm::HeapType>_> *__range2_1;
  uintptr_t local_1d8;
  undefined1 local_1d0 [8];
  Field array16Element;
  HeapType array16;
  vector<wasm::HeapType,_std::allocator<wasm::HeapType>_> allTypes;
  HeapType local_198;
  undefined1 local_190 [8];
  TypeUpdates updates;
  Type local_150;
  Signature local_148;
  HeapType local_138;
  uintptr_t local_130;
  value_type local_128;
  uintptr_t local_120;
  Type result;
  Iterator __end3_1;
  Iterator __begin3_1;
  Type local_f0;
  Type *local_e8;
  Type *__range3_1;
  value_type local_d8;
  uintptr_t local_d0;
  Type param;
  Iterator __end3;
  Iterator __begin3;
  Signature local_98;
  Signature *local_88;
  Type *__range3;
  undefined1 local_78 [7];
  anon_class_1_0_00000001 fix;
  vector<wasm::Type,_std::allocator<wasm::Type>_> results;
  vector<wasm::Type,_std::allocator<wasm::Type>_> params;
  RecGroup local_40;
  reference local_38;
  unique_ptr<wasm::Function,_std::default_delete<wasm::Function>_> *func;
  iterator __end2;
  iterator __begin2;
  vector<std::unique_ptr<wasm::Function,_std::default_delete<wasm::Function>_>,_std::allocator<std::unique_ptr<wasm::Function,_std::default_delete<wasm::Function>_>_>_>
  *__range2;
  Module *module_local;
  StringLowering *this_local;
  
  __end2 = std::
           vector<std::unique_ptr<wasm::Function,_std::default_delete<wasm::Function>_>,_std::allocator<std::unique_ptr<wasm::Function,_std::default_delete<wasm::Function>_>_>_>
           ::begin(&module->functions);
  func = (unique_ptr<wasm::Function,_std::default_delete<wasm::Function>_> *)
         std::
         vector<std::unique_ptr<wasm::Function,_std::default_delete<wasm::Function>_>,_std::allocator<std::unique_ptr<wasm::Function,_std::default_delete<wasm::Function>_>_>_>
         ::end(&module->functions);
  while( true ) {
    bVar1 = __gnu_cxx::operator!=
                      (&__end2,(__normal_iterator<std::unique_ptr<wasm::Function,_std::default_delete<wasm::Function>_>_*,_std::vector<std::unique_ptr<wasm::Function,_std::default_delete<wasm::Function>_>,_std::allocator<std::unique_ptr<wasm::Function,_std::default_delete<wasm::Function>_>_>_>_>
                                *)&func);
    if (!bVar1) break;
    local_38 = __gnu_cxx::
               __normal_iterator<std::unique_ptr<wasm::Function,_std::default_delete<wasm::Function>_>_*,_std::vector<std::unique_ptr<wasm::Function,_std::default_delete<wasm::Function>_>,_std::allocator<std::unique_ptr<wasm::Function,_std::default_delete<wasm::Function>_>_>_>_>
               ::operator*(&__end2);
    pFVar2 = std::unique_ptr<wasm::Function,_std::default_delete<wasm::Function>_>::operator->
                       (local_38);
    local_40 = HeapType::getRecGroup(&pFVar2->type);
    sVar3 = RecGroup::size(&local_40);
    local_2f1 = 1;
    if (sVar3 == 1) {
      pFVar2 = std::unique_ptr<wasm::Function,_std::default_delete<wasm::Function>_>::operator->
                         (local_38);
      params.super__Vector_base<wasm::Type,_std::allocator<wasm::Type>_>._M_impl.
      super__Vector_impl_data._M_end_of_storage._4_4_ = HeapType::getFeatures(&pFVar2->type);
      bVar1 = FeatureSet::hasStrings
                        ((FeatureSet *)
                         ((long)&params.super__Vector_base<wasm::Type,_std::allocator<wasm::Type>_>.
                                 _M_impl.super__Vector_impl_data._M_end_of_storage + 4));
      local_2f1 = bVar1 ^ 0xff;
    }
    if ((local_2f1 & 1) == 0) {
      std::vector<wasm::Type,_std::allocator<wasm::Type>_>::vector
                ((vector<wasm::Type,_std::allocator<wasm::Type>_> *)
                 &results.super__Vector_base<wasm::Type,_std::allocator<wasm::Type>_>._M_impl.
                  super__Vector_impl_data._M_end_of_storage);
      std::vector<wasm::Type,_std::allocator<wasm::Type>_>::vector
                ((vector<wasm::Type,_std::allocator<wasm::Type>_> *)local_78);
      pFVar2 = std::unique_ptr<wasm::Function,_std::default_delete<wasm::Function>_>::operator->
                         (local_38);
      SVar7 = HeapType::getSignature(&pFVar2->type);
      local_88 = &local_98;
      local_98 = SVar7;
      IVar8 = wasm::Type::begin(&local_88->params);
      __end3.super_ParentIndexIterator<const_wasm::Type_*,_wasm::Type::Iterator>.index =
           (size_t)IVar8.super_ParentIndexIterator<const_wasm::Type_*,_wasm::Type::Iterator>.parent;
      PVar9 = (ParentIndexIterator<const_wasm::Type_*,_wasm::Type::Iterator>)
              wasm::Type::end(&local_88->params);
      while( true ) {
        __end3.super_ParentIndexIterator<const_wasm::Type_*,_wasm::Type::Iterator>.parent =
             (Type *)PVar9.index;
        param.id = (uintptr_t)PVar9.parent;
        bVar1 = ParentIndexIterator<const_wasm::Type_*,_wasm::Type::Iterator>::operator!=
                          ((ParentIndexIterator<const_wasm::Type_*,_wasm::Type::Iterator> *)
                           &__end3.
                            super_ParentIndexIterator<const_wasm::Type_*,_wasm::Type::Iterator>.
                            index,(ParentIndexIterator<const_wasm::Type_*,_wasm::Type::Iterator> *)
                                  &param);
        if (!bVar1) break;
        pTVar4 = wasm::Type::Iterator::operator*
                           ((Iterator *)
                            &__end3.
                             super_ParentIndexIterator<const_wasm::Type_*,_wasm::Type::Iterator>.
                             index);
        __range3_1 = (Type *)pTVar4->id;
        local_d0 = (uintptr_t)__range3_1;
        local_d8.id = (uintptr_t)
                      updateTypes::anon_class_1_0_00000001::operator()
                                ((anon_class_1_0_00000001 *)((long)&__range3 + 7),(Type)__range3_1);
        std::vector<wasm::Type,_std::allocator<wasm::Type>_>::push_back
                  ((vector<wasm::Type,_std::allocator<wasm::Type>_> *)
                   &results.super__Vector_base<wasm::Type,_std::allocator<wasm::Type>_>._M_impl.
                    super__Vector_impl_data._M_end_of_storage,&local_d8);
        ParentIndexIterator<const_wasm::Type_*,_wasm::Type::Iterator>::operator++
                  ((ParentIndexIterator<const_wasm::Type_*,_wasm::Type::Iterator> *)
                   &__end3.super_ParentIndexIterator<const_wasm::Type_*,_wasm::Type::Iterator>.index
                  );
        PVar9.index = (size_t)__end3.
                              super_ParentIndexIterator<const_wasm::Type_*,_wasm::Type::Iterator>.
                              parent;
        PVar9.parent = (Type *)param.id;
      }
      pFVar2 = std::unique_ptr<wasm::Function,_std::default_delete<wasm::Function>_>::operator->
                         (local_38);
      SVar7 = HeapType::getSignature(&pFVar2->type);
      local_f0 = SVar7.results.id;
      local_e8 = &local_f0;
      IVar8 = wasm::Type::begin(local_e8);
      __end3_1.super_ParentIndexIterator<const_wasm::Type_*,_wasm::Type::Iterator>.index =
           (size_t)IVar8.super_ParentIndexIterator<const_wasm::Type_*,_wasm::Type::Iterator>.parent;
      PVar10 = (ParentIndexIterator<const_wasm::Type_*,_wasm::Type::Iterator>)
               wasm::Type::end(local_e8);
      while( true ) {
        __end3_1.super_ParentIndexIterator<const_wasm::Type_*,_wasm::Type::Iterator>.parent =
             (Type *)PVar10.index;
        result.id = (uintptr_t)PVar10.parent;
        bVar1 = ParentIndexIterator<const_wasm::Type_*,_wasm::Type::Iterator>::operator!=
                          ((ParentIndexIterator<const_wasm::Type_*,_wasm::Type::Iterator> *)
                           &__end3_1.
                            super_ParentIndexIterator<const_wasm::Type_*,_wasm::Type::Iterator>.
                            index,(ParentIndexIterator<const_wasm::Type_*,_wasm::Type::Iterator> *)
                                  &result);
        if (!bVar1) break;
        pTVar4 = wasm::Type::Iterator::operator*
                           ((Iterator *)
                            &__end3_1.
                             super_ParentIndexIterator<const_wasm::Type_*,_wasm::Type::Iterator>.
                             index);
        local_130 = pTVar4->id;
        local_120 = local_130;
        local_128.id = (uintptr_t)
                       updateTypes::anon_class_1_0_00000001::operator()
                                 ((anon_class_1_0_00000001 *)((long)&__range3 + 7),local_130);
        std::vector<wasm::Type,_std::allocator<wasm::Type>_>::push_back
                  ((vector<wasm::Type,_std::allocator<wasm::Type>_> *)local_78,&local_128);
        ParentIndexIterator<const_wasm::Type_*,_wasm::Type::Iterator>::operator++
                  ((ParentIndexIterator<const_wasm::Type_*,_wasm::Type::Iterator> *)
                   &__end3_1.super_ParentIndexIterator<const_wasm::Type_*,_wasm::Type::Iterator>.
                    index);
        PVar10.index = (size_t)__end3_1.
                               super_ParentIndexIterator<const_wasm::Type_*,_wasm::Type::Iterator>.
                               parent;
        PVar10.parent = (Type *)result.id;
      }
      wasm::Type::Type(&local_150,
                       (Tuple *)&results.super__Vector_base<wasm::Type,_std::allocator<wasm::Type>_>
                                 ._M_impl.super__Vector_impl_data._M_end_of_storage);
      wasm::Type::Type((Type *)&updates._M_h._M_single_bucket,(Tuple *)local_78);
      Signature::Signature(&local_148,local_150,(Type)updates._M_h._M_single_bucket);
      HeapType::HeapType(&local_138,local_148);
      pFVar2 = std::unique_ptr<wasm::Function,_std::default_delete<wasm::Function>_>::operator->
                         (local_38);
      (pFVar2->type).id = local_138.id;
      std::vector<wasm::Type,_std::allocator<wasm::Type>_>::~vector
                ((vector<wasm::Type,_std::allocator<wasm::Type>_> *)local_78);
      std::vector<wasm::Type,_std::allocator<wasm::Type>_>::~vector
                ((vector<wasm::Type,_std::allocator<wasm::Type>_> *)
                 &results.super__Vector_base<wasm::Type,_std::allocator<wasm::Type>_>._M_impl.
                  super__Vector_impl_data._M_end_of_storage);
    }
    __gnu_cxx::
    __normal_iterator<std::unique_ptr<wasm::Function,_std::default_delete<wasm::Function>_>_*,_std::vector<std::unique_ptr<wasm::Function,_std::default_delete<wasm::Function>_>,_std::allocator<std::unique_ptr<wasm::Function,_std::default_delete<wasm::Function>_>_>_>_>
    ::operator++(&__end2);
  }
  std::
  unordered_map<wasm::HeapType,_wasm::HeapType,_std::hash<wasm::HeapType>,_std::equal_to<wasm::HeapType>,_std::allocator<std::pair<const_wasm::HeapType,_wasm::HeapType>_>_>
  ::unordered_map((unordered_map<wasm::HeapType,_wasm::HeapType,_std::hash<wasm::HeapType>,_std::equal_to<wasm::HeapType>,_std::allocator<std::pair<const_wasm::HeapType,_wasm::HeapType>_>_>
                   *)local_190);
  HeapType::HeapType(&local_198,ext);
  HeapType::HeapType((HeapType *)
                     &allTypes.super__Vector_base<wasm::HeapType,_std::allocator<wasm::HeapType>_>.
                      _M_impl.super__Vector_impl_data._M_end_of_storage,string);
  pmVar5 = std::
           unordered_map<wasm::HeapType,_wasm::HeapType,_std::hash<wasm::HeapType>,_std::equal_to<wasm::HeapType>,_std::allocator<std::pair<const_wasm::HeapType,_wasm::HeapType>_>_>
           ::operator[]((unordered_map<wasm::HeapType,_wasm::HeapType,_std::hash<wasm::HeapType>,_std::equal_to<wasm::HeapType>,_std::allocator<std::pair<const_wasm::HeapType,_wasm::HeapType>_>_>
                         *)local_190,
                        (key_type *)
                        &allTypes.
                         super__Vector_base<wasm::HeapType,_std::allocator<wasm::HeapType>_>._M_impl
                         .super__Vector_impl_data._M_end_of_storage);
  pmVar5->id = local_198.id;
  wasm::ModuleUtils::collectHeapTypes
            ((vector<wasm::HeapType,_std::allocator<wasm::HeapType>_> *)&array16,module);
  array16Element._8_8_ = wasm::Type::getHeapType(&this->nullArray16);
  HeapType::getArray((HeapType *)&__range2_1);
  local_1d0 = (undefined1  [8])__range2_1;
  array16Element.type.id = local_1d8;
  __end2_1 = std::vector<wasm::HeapType,_std::allocator<wasm::HeapType>_>::begin
                       ((vector<wasm::HeapType,_std::allocator<wasm::HeapType>_> *)&array16);
  type.id = (uintptr_t)
            std::vector<wasm::HeapType,_std::allocator<wasm::HeapType>_>::end
                      ((vector<wasm::HeapType,_std::allocator<wasm::HeapType>_> *)&array16);
  while( true ) {
    bVar1 = __gnu_cxx::operator!=
                      (&__end2_1,
                       (__normal_iterator<wasm::HeapType_*,_std::vector<wasm::HeapType,_std::allocator<wasm::HeapType>_>_>
                        *)&type);
    if (!bVar1) break;
    pHVar6 = __gnu_cxx::
             __normal_iterator<wasm::HeapType_*,_std::vector<wasm::HeapType,_std::allocator<wasm::HeapType>_>_>
             ::operator*(&__end2_1);
    local_200.id = pHVar6->id;
    bVar1 = HeapType::isArray(&local_200);
    local_39a = false;
    if (bVar1) {
      oVar11 = HeapType::getDeclaredSuperType(&local_200);
      local_210 = oVar11.super__Optional_base<wasm::HeapType,_true,_true>._M_payload.
                  super__Optional_payload_base<wasm::HeapType>._M_payload;
      local_208 = oVar11.super__Optional_base<wasm::HeapType,_true,_true>._M_payload.
                  super__Optional_payload_base<wasm::HeapType>._M_engaged;
      bVar1 = std::optional::operator_cast_to_bool((optional *)&local_210._M_value);
      local_39a = false;
      if (!bVar1) {
        bVar1 = HeapType::isOpen(&local_200);
        local_39a = false;
        if (!bVar1) {
          HeapType::getArray((HeapType *)&local_220);
          local_39a = Field::operator==(&local_220,(Field *)local_1d0);
        }
      }
    }
    if (local_39a != false) {
      pmVar5 = std::
               unordered_map<wasm::HeapType,_wasm::HeapType,_std::hash<wasm::HeapType>,_std::equal_to<wasm::HeapType>,_std::allocator<std::pair<const_wasm::HeapType,_wasm::HeapType>_>_>
               ::operator[]((unordered_map<wasm::HeapType,_wasm::HeapType,_std::hash<wasm::HeapType>,_std::equal_to<wasm::HeapType>,_std::allocator<std::pair<const_wasm::HeapType,_wasm::HeapType>_>_>
                             *)local_190,&local_200);
      pmVar5->id = array16Element._8_8_;
    }
    __gnu_cxx::
    __normal_iterator<wasm::HeapType_*,_std::vector<wasm::HeapType,_std::allocator<wasm::HeapType>_>_>
    ::operator++(&__end2_1);
  }
  TypeMapper::TypeMapper(&local_2c8,module,(TypeUpdates *)local_190);
  local_2e8.super__Vector_base<wasm::HeapType,_std::allocator<wasm::HeapType>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  local_2e8.super__Vector_base<wasm::HeapType,_std::allocator<wasm::HeapType>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  local_2e8.super__Vector_base<wasm::HeapType,_std::allocator<wasm::HeapType>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  std::vector<wasm::HeapType,_std::allocator<wasm::HeapType>_>::vector(&local_2e8);
  TypeMapper::map(&local_2c8,&local_2e8);
  std::vector<wasm::HeapType,_std::allocator<wasm::HeapType>_>::~vector(&local_2e8);
  TypeMapper::~TypeMapper(&local_2c8);
  std::vector<wasm::HeapType,_std::allocator<wasm::HeapType>_>::~vector
            ((vector<wasm::HeapType,_std::allocator<wasm::HeapType>_> *)&array16);
  std::
  unordered_map<wasm::HeapType,_wasm::HeapType,_std::hash<wasm::HeapType>,_std::equal_to<wasm::HeapType>,_std::allocator<std::pair<const_wasm::HeapType,_wasm::HeapType>_>_>
  ::~unordered_map((unordered_map<wasm::HeapType,_wasm::HeapType,_std::hash<wasm::HeapType>,_std::equal_to<wasm::HeapType>,_std::allocator<std::pair<const_wasm::HeapType,_wasm::HeapType>_>_>
                    *)local_190);
  return;
}

Assistant:

void updateTypes(Module* module) {
    // TypeMapper will not handle public types, but we do want to modify them as
    // well: we are modifying the public ABI here. We can't simply tell
    // TypeMapper to consider them private, as then they'd end up in the new big
    // rec group with the private types (and as they are public, that would make
    // the entire rec group public, and all types in the module with it).
    // Instead, manually handle singleton-rec groups of function types. This
    // keeps them at size 1, as expected, and handles the cases of function
    // imports and exports. If we need more (non-function types, non-singleton
    // rec groups, etc.) then more work will be necessary TODO
    //
    // Note that we do this before TypeMapper, which allows it to then fix up
    // things like the types of parameters (which depend on the type of the
    // function, which must be modified either in TypeMapper - but as just
    // explained we cannot do that - or before it, which is what we do here).
    for (auto& func : module->functions) {
      if (func->type.getRecGroup().size() != 1 ||
          !func->type.getFeatures().hasStrings()) {
        continue;
      }

      // Fix up the stringrefs in this type that uses strings and is in a
      // singleton rec group.
      std::vector<Type> params, results;
      auto fix = [](Type t) {
        if (t.isRef() && t.getHeapType().isMaybeShared(HeapType::string)) {
          auto share = t.getHeapType().getShared();
          t = Type(HeapTypes::ext.getBasic(share), t.getNullability());
        }
        return t;
      };
      for (auto param : func->type.getSignature().params) {
        params.push_back(fix(param));
      }
      for (auto result : func->type.getSignature().results) {
        results.push_back(fix(result));
      }
      func->type = Signature(params, results);
    }

    TypeMapper::TypeUpdates updates;

    // Strings turn into externref.
    updates[HeapType::string] = HeapType::ext;

    // The module may have its own array16 type inside a big rec group, but
    // imported strings expects that type in its own rec group as part of the
    // ABI. Fix that up here. (This is valid to do as this type has no sub- or
    // super-types anyhow; it is "plain old data" for communicating with the
    // outside.)
    auto allTypes = ModuleUtils::collectHeapTypes(*module);
    auto array16 = nullArray16.getHeapType();
    auto array16Element = array16.getArray().element;
    for (auto type : allTypes) {
      // Match an array type with no super and that is closed.
      if (type.isArray() && !type.getDeclaredSuperType() && !type.isOpen() &&
          type.getArray().element == array16Element) {
        updates[type] = array16;
      }
    }

    TypeMapper(*module, updates).map();
  }